

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selist.c
# Opt level: O2

_Bool selist_set_insert(selist **qlp,void *data,cmp_cb cmp)

{
  selist *psVar1;
  int iVar2;
  ulong uVar3;
  code *pcVar4;
  
  pcVar4 = cmp;
  while( true ) {
    psVar1 = ((selist *)qlp)->next;
    if (psVar1 == (selist *)0x0) goto LAB_00107e19;
    if (pcVar4 == (cmp_cb)0x0) {
      pcVar4 = cmp_voidptr;
    }
    if ((psVar1->num_elements < 1) ||
       (iVar2 = (*pcVar4)(psVar1->elements[psVar1->num_elements - 1],data), -1 < iVar2)) break;
    iVar2 = psVar1->num_elements;
    qlp = &psVar1->next;
    if (iVar2 != 0xe) {
      if (psVar1->next == (selist *)0x0) goto LAB_00107de7;
      iVar2 = (*pcVar4)(psVar1->next->elements[0],data);
      if (0 < iVar2) {
        iVar2 = psVar1->num_elements;
LAB_00107de7:
        psVar1->num_elements = iVar2 + 1;
        psVar1->elements[iVar2] = data;
        return true;
      }
    }
  }
  for (uVar3 = 0; uVar3 != (uint)psVar1->num_elements; uVar3 = uVar3 + 1) {
    iVar2 = (*pcVar4)(data,psVar1->elements[uVar3]);
    if (iVar2 < 0) {
      selist_insert(qlp,(int)uVar3,data);
      return true;
    }
    if (iVar2 == 0) {
      return false;
    }
  }
LAB_00107e19:
  selist_push(qlp,data);
  return true;
}

Assistant:

bool selist_set_insert(struct selist **qlp, void *data, cmp_cb cmp)
{
    if (*qlp) {
        selist *ql = *qlp;
        if (cmp==NULL) cmp = cmp_voidptr;
        if (ql->num_elements > 0 && cmp(ql->elements[ql->num_elements - 1], data) < 0) {
            if (ql->num_elements == LIST_MAXSIZE || (ql->next
                && cmp(ql->next->elements[0], data) <= 0)) {
                return selist_set_insert(&ql->next, data, cmp);
            }
            else {
                ql->elements[ql->num_elements++] = data;
            }
            return true;
        }
        else {
            int i;
            /* TODO: OPT | binary search */
            for (i = 0; i != ql->num_elements; ++i) {
                int cmpi = cmp(data, ql->elements[i]);
                if (cmpi < 0) {
                    selist_insert(qlp, i, data);
                    return true;
                }
                if (cmpi == 0) {
                    return false;
                }
            }
        }
    }
    selist_push(qlp, data);
    return true;
}